

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O2

void __thiscall chrono::robosimian::RS_Part::~RS_Part(RS_Part *this)

{
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_0019f9b8;
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::
  ~vector(&this->m_meshes);
  std::
  _Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::~_Vector_base(&(this->m_cylinders).
                   super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                 );
  std::
  _Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>::
  ~_Vector_base(&(this->m_spheres).
                 super__Vector_base<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>
               );
  std::_Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::
  ~_Vector_base(&(this->m_boxes).
                 super__Vector_base<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~RS_Part() {}